

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.h
# Opt level: O0

void stats_sample_value(stats_t *stats,double x)

{
  unsigned_long uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double local_30;
  double local_28;
  double delta;
  double x_local;
  stats_t *stats_local;
  
  stats->_sum = stats->_sum + x;
  if (stats->_n == 0) {
    stats->_min = x;
    stats->_max = x;
  }
  else {
    local_28 = x;
    if (stats->_min < x) {
      local_28 = stats->_min;
    }
    stats->_min = local_28;
    local_30 = x;
    if (x < stats->_max) {
      local_30 = stats->_max;
    }
    stats->_max = local_30;
  }
  stats->_n = stats->_n + 1;
  dVar2 = x - stats->_mean;
  uVar1 = stats->_n;
  auVar3._8_4_ = (int)(uVar1 >> 0x20);
  auVar3._0_8_ = uVar1;
  auVar3._12_4_ = 0x45300000;
  stats->_mean = stats->_mean +
                 dVar2 / ((auVar3._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  stats->_M2 = dVar2 * (x - stats->_mean) + stats->_M2;
  return;
}

Assistant:

static inline void stats_sample_value(stats_t *stats, const double x) {
    double delta = 0;

    /* extra stats */
    stats->_sum = stats->_sum + x;
    if (0UL == stats->_n) {
        stats->_min = x;
        stats->_max = x;
    }
    else {
        stats->_min = stats->_min < x ? stats->_min : x;
        stats->_max = stats->_max > x ? stats->_max : x;
    }

    stats->_n = stats->_n + 1UL;
    delta = x - stats->_mean;
    stats->_mean = stats->_mean + delta/stats->_n;
    stats->_M2 = stats->_M2 + delta * (x - stats->_mean);
}